

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool __thiscall libcellml::Units::removeUnit(Units *this,string *reference)

{
  bool bVar1;
  UnitsImpl *pUVar2;
  __normal_iterator<libcellml::UnitDefinition_*,_std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>_>
  local_30;
  __normal_iterator<const_libcellml::UnitDefinition_*,_std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>_>
  local_28;
  const_iterator result;
  bool status;
  string *reference_local;
  Units *this_local;
  
  result._M_current._7_1_ = 0;
  pUVar2 = pFunc(this);
  local_28._M_current = (UnitDefinition *)UnitsImpl::findUnit(pUVar2,reference);
  pUVar2 = pFunc(this);
  local_30._M_current =
       (UnitDefinition *)
       std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>::end
                 (&pUVar2->mUnitDefinitions);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
  if (bVar1) {
    pUVar2 = pFunc(this);
    std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>::erase
              (&pUVar2->mUnitDefinitions,(const_iterator)local_28._M_current);
    result._M_current._7_1_ = 1;
  }
  return (bool)(result._M_current._7_1_ & 1);
}

Assistant:

bool Units::removeUnit(const std::string &reference)
{
    bool status = false;
    auto result = pFunc()->findUnit(reference);
    if (result != pFunc()->mUnitDefinitions.end()) {
        pFunc()->mUnitDefinitions.erase(result);
        status = true;
    }

    return status;
}